

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_pHYs(ucvector *out,LodePNGInfo *info)

{
  uchar *puStack_28;
  uint error;
  uchar *chunk;
  LodePNGInfo *info_local;
  ucvector *out_local;
  
  chunk = (uchar *)info;
  info_local = (LodePNGInfo *)out;
  out_local._4_4_ = lodepng_chunk_init(&stack0xffffffffffffffd8,out,9,"pHYs");
  if (out_local._4_4_ == 0) {
    lodepng_set32bitInt(puStack_28 + 8,*(uint *)(chunk + 0xa8));
    lodepng_set32bitInt(puStack_28 + 0xc,*(uint *)(chunk + 0xac));
    puStack_28[0x10] = (uchar)*(undefined4 *)(chunk + 0xb0);
    lodepng_chunk_generate_crc(puStack_28);
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_pHYs(ucvector* out, const LodePNGInfo* info) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 9, "pHYs"));
  lodepng_set32bitInt(chunk + 8, info->phys_x);
  lodepng_set32bitInt(chunk + 12, info->phys_y);
  chunk[16] = info->phys_unit;
  lodepng_chunk_generate_crc(chunk);
  return 0;
}